

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

gui_view * __thiscall
boost::ext::di::v1_3_0::core::successful::provider<$18059737$>::
get<boost::ext::di::v1_3_0::type_traits::heap>(provider<_18059737_> *this,heap *memory)

{
  heap *phVar1;
  config *this_00;
  gui_view *pgVar2;
  type<boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>_> local_39;
  any_type_ref<gui_view,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_annotations_to_the_rescue_cpp:91:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,_timer,_timer,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_boost::ext::di::v1_3_0::core::override,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_annotations_to_the_rescue_cpp:17:13),_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_annotations_to_the_rescue_cpp:18:13),_void,_boost::ext::di::v1_3_0::core::none>_>_>
  local_38;
  type<boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>_> local_29;
  any_type_ref<gui_view,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_annotations_to_the_rescue_cpp:91:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,_timer,_timer,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_boost::ext::di::v1_3_0::core::override,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_annotations_to_the_rescue_cpp:17:13),_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_annotations_to_the_rescue_cpp:18:13),_void,_boost::ext::di::v1_3_0::core::none>_>_>
  local_28;
  direct local_1b [2];
  stack_over_heap local_19;
  heap *local_18;
  heap *memory_local;
  provider<_18059737_> *this_local;
  
  local_18 = memory;
  memory_local = (heap *)this;
  this_00 = cfg(this);
  config::
  provider<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::__0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::override,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,__1,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,__2,void,boost::ext::di::v1_3_0::core::none>>const>
            (this_00,this->injector_);
  phVar1 = local_18;
  local_28 = injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::override,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,$_1,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>
             ::
             create_successful_impl<boost::ext::di::v1_3_0::aux::integral_constant<bool,false>,gui_view>
                       ((injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::__0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::override,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,__1,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,__2,void,boost::ext::di::v1_3_0::core::none>>
                         *)this->injector_,&local_29);
  local_38 = injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::override,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,$_1,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>
             ::
             create_successful_impl<boost::ext::di::v1_3_0::aux::integral_constant<bool,false>,gui_view>
                       ((injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::__0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::override,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,__1,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,__2,void,boost::ext::di::v1_3_0::core::none>>
                         *)this->injector_,&local_39);
  pgVar2 = providers::stack_over_heap::
           get<gui_view,boost::ext::di::v1_3_0::core::successful::any_type_ref<gui_view,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::__0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0:___ncy<boost::ext::di::v1_3_0::scopes::instance,int,int,__2,void,boost::ext::di::v1_3_0::core::none>>>>
                     (&local_19,local_1b,phVar1,&local_28,&local_38);
  return pgVar2;
}

Assistant:

auto get(const TMemory& memory = {}) const {
    return cfg().provider(injector_).template get<T>(
        TInitialization{}, memory, ((const injector__<TInjector>*)injector_)->create_successful_impl(aux::type<TCtor>{})...);
  }